

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

EdgeData * axisEdgeData(QTextTable *table,QTextTableData *td,QTextTableCell *cell,Edge edge)

{
  bool bVar1;
  QTextTableData *in_RCX;
  QTextTable *in_RDX;
  EdgeData *in_RSI;
  EdgeData *in_RDI;
  Edge in_R8D;
  long in_FS_OFFSET;
  bool mustCheckThirdCell;
  EdgeData *result;
  QTextTableCell ac;
  EdgeData *in_stack_ffffffffffffff28;
  EdgeData *in_stack_ffffffffffffff30;
  EdgeData *a;
  Edge competingCellEdge;
  uint in_stack_ffffffffffffff68;
  Edge in_stack_ffffffffffffff6c;
  uint3 in_stack_ffffffffffffff70;
  uint uVar2;
  QTextTableCell local_68 [5];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (uint)in_stack_ffffffffffffff70;
  in_RDI->width = -NAN;
  (in_RDI->cell).table = (QTextTable *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->cell).fragment = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->edge = &DAT_aaaaaaaaaaaaaaaa;
  cellEdgeData(in_RDX,in_RCX,(QTextTableCell *)CONCAT44(in_R8D,uVar2),in_stack_ffffffffffffff6c);
  if ((in_RDX[0x14].super_QTextFrame.super_QTextObject.field_0x8 & 1) == 0) {
    uVar2 = 0x1000000;
  }
  else {
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    adjacentCell((QTextTable *)in_RCX,(QTextTableCell *)CONCAT44(in_R8D,uVar2),
                 in_stack_ffffffffffffff6c);
    adjacentEdge(in_R8D);
    cellEdgeData(in_RDX,in_RCX,(QTextTableCell *)CONCAT44(in_R8D,uVar2),in_stack_ffffffffffffff6c);
    qMax<EdgeData>(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    EdgeData::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    EdgeData::~EdgeData((EdgeData *)0x80290b);
    in_stack_ffffffffffffff68 = in_stack_ffffffffffffff68 & 0xffffff;
    bVar1 = QTextTableCell::isValid((QTextTableCell *)local_18);
    if (bVar1) {
      competingCellEdge = (Edge)((ulong)in_RDI >> 0x20);
      switch(in_R8D) {
      case TopEdge:
      case BottomEdge:
        bVar1 = sharesAxis((QTextTableCell *)in_RCX,in_R8D,
                           (QTextTableCell *)
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                           competingCellEdge);
        in_stack_ffffffffffffff68 = ((uint)bVar1 << 0x18 ^ 0xff000000) & 0x1ffffff;
        break;
      case RightEdge:
      case LeftEdge:
        bVar1 = sharesAxis((QTextTableCell *)in_RCX,in_R8D,
                           (QTextTableCell *)
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                           competingCellEdge);
        in_stack_ffffffffffffff68 = ((uint)bVar1 << 0x18 ^ 0xff000000) & 0x1ffffff;
      }
    }
    if ((in_stack_ffffffffffffff68 & 0x1000000) != 0) {
      a = in_RSI;
      adjacentEdge(in_R8D);
      adjacentCell((QTextTable *)in_RCX,(QTextTableCell *)CONCAT44(in_R8D,uVar2),
                   in_stack_ffffffffffffff6c);
      cellEdgeData(in_RDX,in_RCX,(QTextTableCell *)CONCAT44(in_R8D,uVar2),in_stack_ffffffffffffff6c)
      ;
      qMax<EdgeData>(a,in_RSI);
      EdgeData::operator=(a,in_RSI);
      EdgeData::~EdgeData((EdgeData *)0x802a25);
      QTextTableCell::~QTextTableCell(local_68);
    }
    uVar2 = 0x1000000;
    QTextTableCell::~QTextTableCell((QTextTableCell *)local_18);
  }
  if ((uVar2 & 0x1000000) == 0) {
    EdgeData::~EdgeData((EdgeData *)0x802a5a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static inline EdgeData axisEdgeData(QTextTable *table, const QTextTableData *td,
                                    const QTextTableCell &cell, QCss::Edge edge)
{
    Q_ASSERT(cell.isValid());

    EdgeData result = cellEdgeData(table, td, cell, edge);
    if (!td->borderCollapse)
        return result;

    QTextTableCell ac = adjacentCell(table, cell, edge);
    result = qMax(result, cellEdgeData(table, td, ac, adjacentEdge(edge)));

    bool mustCheckThirdCell = false;
    if (ac.isValid()) {
        /* if C0 and C3 don't share the left/top axis, we must
         * also check C1.
         *
         * C0 and C4 don't share the left axis so we have
         * to take the top edge of C1 (T1) into account
         * because this might be wider than C0's bottom
         * edge (B0). For the sake of simplicity we skip
         * checking T2 and T3.
         *
         * | C0
         * |-----|-----|----|-----
         * | C1  | C2  | C3 | C4
         *
         * width(T4) = max(T4, B0, T1) (T2 and T3 won't be checked)
         */
        switch (edge) {
        case QCss::TopEdge:
        case QCss::BottomEdge:
            mustCheckThirdCell = !sharesAxis(cell, QCss::LeftEdge, ac, QCss::LeftEdge);
            break;
        case QCss::LeftEdge:
        case QCss::RightEdge:
            mustCheckThirdCell = !sharesAxis(cell, QCss::TopEdge, ac, QCss::TopEdge);
            break;
        default:
            Q_UNREACHABLE();
            break;
        }
    }

    if (mustCheckThirdCell)
        result = qMax(result, cellEdgeData(table, td, adjacentCell(table, ac, adjacentEdge(edge)), edge));

    return result;
}